

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidload.c
# Opt level: O3

FT_Error cid_hex_to_binary(FT_Byte *data,FT_ULong data_len,FT_ULong offset,CID_Face face,
                          FT_ULong *data_written)

{
  byte bVar1;
  FT_Error FVar2;
  FT_ULong FVar3;
  byte *pbVar4;
  FT_ULong FVar5;
  byte *pbVar6;
  FT_Byte FVar7;
  char cVar8;
  uint uVar9;
  byte bVar10;
  FT_Byte *pFVar11;
  FT_Byte *pFVar12;
  FT_Byte buffer [256];
  byte local_138 [264];
  
  FVar2 = FT_Stream_Seek((FT_Stream)face,offset);
  pFVar12 = data;
  if (FVar2 == 0) {
    if ((long)data_len < 1) {
      FVar2 = 0;
    }
    else {
      cVar8 = '\x01';
      pbVar4 = local_138;
      pbVar6 = local_138;
LAB_00226243:
      do {
        if (pbVar4 <= pbVar6) {
          FVar3 = FT_Stream_Pos((FT_Stream)face);
          FVar5 = (face->root).face_index - FVar3;
          if (FVar5 == 0) {
            FVar2 = 0xa0;
            goto LAB_0022633c;
          }
          if (0xff < FVar5) {
            FVar5 = 0x100;
          }
          FVar2 = FT_Stream_Read((FT_Stream)face,local_138,FVar5);
          if (FVar2 != 0) goto LAB_0022633c;
          FVar5 = FT_Stream_Pos((FT_Stream)face);
          pbVar4 = local_138 + (FVar5 - FVar3);
          pbVar6 = local_138;
        }
        bVar10 = *pbVar6;
        uVar9 = bVar10 - 0x30;
        if (uVar9 < 10) {
          bVar1 = 1;
        }
        else {
          if ((byte)(bVar10 + 0x9f) < 6) {
            bVar10 = bVar10 + 0xa9;
          }
          else {
            if (5 < (byte)(bVar10 + 0xbf)) {
              FVar2 = 0xa0;
              uVar9 = (uint)bVar10;
              if (0x3e < uVar9) goto LAB_0022633c;
              if ((0x100003601U >> ((ulong)uVar9 & 0x3f) & 1) == 0) {
                if ((ulong)uVar9 == 0x3e) {
                  uVar9 = 0;
                  bVar1 = 0;
                  goto LAB_002262df;
                }
                goto LAB_0022633c;
              }
              pbVar6 = pbVar6 + 1;
              goto LAB_00226243;
            }
            bVar10 = bVar10 - 0x37;
          }
          bVar1 = 1;
          uVar9 = (uint)bVar10;
        }
LAB_002262df:
        if (cVar8 == '\0') {
          FVar7 = (char)uVar9 + *pFVar12;
          pFVar11 = pFVar12 + 1;
        }
        else {
          FVar7 = (char)uVar9 << 4;
          pFVar11 = pFVar12;
        }
        *pFVar12 = FVar7;
        cVar8 = '\x01' - cVar8;
        pbVar6 = pbVar6 + 1;
        pFVar12 = pFVar11;
      } while ((bool)(bVar1 & pFVar11 < data + data_len));
      FVar2 = 0;
    }
  }
LAB_0022633c:
  *data_written = (long)pFVar12 - (long)data;
  return FVar2;
}

Assistant:

static FT_Error
  cid_hex_to_binary( FT_Byte*   data,
                     FT_ULong   data_len,
                     FT_ULong   offset,
                     CID_Face   face,
                     FT_ULong*  data_written )
  {
    FT_Stream  stream = face->root.stream;
    FT_Error   error;

    FT_Byte    buffer[256];
    FT_Byte   *p, *plimit;
    FT_Byte   *d = data, *dlimit;
    FT_Byte    val;

    FT_Bool    upper_nibble, done;


    if ( FT_STREAM_SEEK( offset ) )
      goto Exit;

    dlimit = d + data_len;
    p      = buffer;
    plimit = p;

    upper_nibble = 1;
    done         = 0;

    while ( d < dlimit )
    {
      if ( p >= plimit )
      {
        FT_ULong  oldpos = FT_STREAM_POS();
        FT_ULong  size   = stream->size - oldpos;


        if ( size == 0 )
        {
          error = FT_THROW( Syntax_Error );
          goto Exit;
        }

        if ( FT_STREAM_READ( buffer, 256 > size ? size : 256 ) )
          goto Exit;
        p      = buffer;
        plimit = p + FT_STREAM_POS() - oldpos;
      }

      if ( ft_isdigit( *p ) )
        val = (FT_Byte)( *p - '0' );
      else if ( *p >= 'a' && *p <= 'f' )
        val = (FT_Byte)( *p - 'a' + 10 );
      else if ( *p >= 'A' && *p <= 'F' )
        val = (FT_Byte)( *p - 'A' + 10 );
      else if ( *p == ' '  ||
                *p == '\t' ||
                *p == '\r' ||
                *p == '\n' ||
                *p == '\f' ||
                *p == '\0' )
      {
        p++;
        continue;
      }
      else if ( *p == '>' )
      {
        val  = 0;
        done = 1;
      }
      else
      {
        error = FT_THROW( Syntax_Error );
        goto Exit;
      }

      if ( upper_nibble )
        *d = (FT_Byte)( val << 4 );
      else
      {
        *d = (FT_Byte)( *d + val );
        d++;
      }

      upper_nibble = (FT_Byte)( 1 - upper_nibble );

      if ( done )
        break;

      p++;
    }

    error = FT_Err_Ok;

  Exit:
    *data_written = (FT_ULong)( d - data );
    return error;
  }